

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O3

void Cec3_ManSimAlloc(Gia_Man_t *p,int nWords)

{
  Vec_Wrd_t *pVVar1;
  word *__s;
  word *pwVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  pVVar1 = p->vSims;
  if (pVVar1 != (Vec_Wrd_t *)0x0) {
    if (pVVar1->pArray != (word *)0x0) {
      free(pVVar1->pArray);
      p->vSims->pArray = (word *)0x0;
      pVVar1 = p->vSims;
      if (pVVar1 == (Vec_Wrd_t *)0x0) goto LAB_0065b71c;
    }
    free(pVVar1);
    p->vSims = (Vec_Wrd_t *)0x0;
  }
LAB_0065b71c:
  pVVar1 = p->vSimsPi;
  if (pVVar1 != (Vec_Wrd_t *)0x0) {
    if (pVVar1->pArray != (word *)0x0) {
      free(pVVar1->pArray);
      p->vSimsPi->pArray = (word *)0x0;
      pVVar1 = p->vSimsPi;
      if (pVVar1 == (Vec_Wrd_t *)0x0) goto LAB_0065b764;
    }
    free(pVVar1);
    p->vSimsPi = (Vec_Wrd_t *)0x0;
  }
LAB_0065b764:
  lVar5 = (long)nWords * (long)p->nObjs;
  pVVar1 = (Vec_Wrd_t *)malloc(0x10);
  iVar3 = (int)lVar5;
  iVar4 = iVar3;
  if (iVar3 - 1U < 0xf) {
    iVar4 = 0x10;
  }
  pVVar1->nCap = iVar4;
  if (iVar4 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar4 << 3);
  }
  pVVar1->pArray = __s;
  pVVar1->nSize = iVar3;
  pwVar2 = (word *)0x0;
  memset(__s,0,lVar5 * 8);
  p->vSims = pVVar1;
  iVar4 = p->vCis->nSize * nWords;
  iVar3 = iVar4 * 4;
  pVVar1 = (Vec_Wrd_t *)malloc(0x10);
  if (iVar4 * 4 - 1U < 0xf) {
    iVar3 = 0x10;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar3;
  if (iVar3 != 0) {
    pwVar2 = (word *)malloc((long)iVar3 << 3);
  }
  pVVar1->pArray = pwVar2;
  p->vSimsPi = pVVar1;
  p->nSimWords = nWords;
  return;
}

Assistant:

void Cec3_ManSimAlloc( Gia_Man_t * p, int nWords )
{
    Vec_WrdFreeP( &p->vSims );
    Vec_WrdFreeP( &p->vSimsPi );
    p->vSims   = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->vSimsPi = Vec_WrdAlloc( Gia_ManCiNum(p) * nWords * 4 ); // storage for CI patterns
    p->nSimWords = nWords;
}